

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_timestep_embedding(ggml_context *ctx,ggml_tensor *timesteps,int dim,int max_period)

{
  ggml_tensor *pgVar1;
  
  pgVar1 = ggml_new_tensor_2d(ctx,GGML_TYPE_F32,(long)(int)((dim & 1U) + dim),timesteps->ne[0]);
  pgVar1->op_params[0] = dim;
  pgVar1->op_params[1] = max_period;
  pgVar1->op = GGML_OP_TIMESTEP_EMBEDDING;
  pgVar1->src[0] = timesteps;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_timestep_embedding(
        struct ggml_context * ctx,
        struct ggml_tensor  * timesteps,
        int                   dim,
        int                   max_period) {
    int actual_dim = dim;
    if (dim % 2 != 0) {
        actual_dim = dim + 1;
    }

    struct ggml_tensor * result = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, actual_dim, timesteps->ne[0]);

    ggml_set_op_params_i32(result, 0, dim);
    ggml_set_op_params_i32(result, 1, max_period);

    result->op     = GGML_OP_TIMESTEP_EMBEDDING;
    result->src[0] = timesteps;

    return result;
}